

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeMemoryInit<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  Index pos_00;
  ParseDefsCtx *this;
  Err *pEVar1;
  Name *mem_00;
  Name *pNVar2;
  undefined1 local_b0 [8];
  Result<wasm::Name> data;
  undefined1 local_78 [8];
  MaybeResult<wasm::Name> mem;
  anon_class_32_4_a44794c9 retry;
  size_t reset;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  annotations_local._4_4_ = pos;
  pPStack_18 = ctx;
  ctx_local = (ParseDefsCtx *)__return_storage_ptr__;
  retry.annotations =
       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
       Lexer::getPos(&ctx->in);
  mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = pPStack_18;
  retry.ctx = (ParseDefsCtx *)&retry.annotations;
  retry.reset = (size_t *)((long)&annotations_local + 4);
  retry.pos = (Index *)annotations;
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_78,pPStack_18);
  pEVar1 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_78);
  if (pEVar1 == (Err *)0x0) {
    dataidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)local_b0,pPStack_18);
    pEVar1 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_b0);
    this = pPStack_18;
    pos_00 = annotations_local._4_4_;
    if (pEVar1 == (Err *)0x0) {
      mem_00 = MaybeResult<wasm::Name>::getPtr((MaybeResult<wasm::Name> *)local_78);
      pNVar2 = Result<wasm::Name>::operator*((Result<wasm::Name> *)local_b0);
      ParseDefsCtx::makeMemoryInit
                (__return_storage_ptr__,this,pos_00,annotations,mem_00,
                 (Name)(pNVar2->super_IString).str);
    }
    else {
      makeMemoryInit<wasm::WATParser::ParseDefsCtx>::anon_class_32_4_a44794c9::operator()
                (__return_storage_ptr__,
                 (anon_class_32_4_a44794c9 *)
                 ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    }
    data.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index = '\x01';
    data.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._33_3_ = 0;
    Result<wasm::Name>::~Result((Result<wasm::Name> *)local_b0);
  }
  else {
    makeMemoryInit<wasm::WATParser::ParseDefsCtx>::anon_class_32_4_a44794c9::operator()
              (__return_storage_ptr__,
               (anon_class_32_4_a44794c9 *)
               ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    data.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index = '\x01';
    data.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._33_3_ = 0;
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeMemoryInit(Ctx& ctx,
                        Index pos,
                        const std::vector<Annotation>& annotations) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the data index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto data = dataidx(ctx);
    CHECK_ERR(data);
    return ctx.makeMemoryInit(pos, annotations, nullptr, *data);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto data = dataidx(ctx);
  if (data.getErr()) {
    return retry();
  }
  return ctx.makeMemoryInit(pos, annotations, mem.getPtr(), *data);
}